

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPSymmetricAlgorithm.cpp
# Opt level: O0

bool __thiscall
OSSLEVPSymmetricAlgorithm::encryptFinal(OSSLEVPSymmetricAlgorithm *this,ByteString *encryptedData)

{
  EVP_CIPHER_CTX *ctx;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uchar *puVar4;
  ulong e;
  char *pcVar5;
  ByteString *in_RSI;
  SymmetricAlgorithm *in_RDI;
  ByteString tag;
  int outLen;
  size_t tagBytes;
  Type mode;
  size_t in_stack_ffffffffffffff58;
  EVP_CIPHER_CTX *in_stack_ffffffffffffff60;
  ByteString *append;
  ByteString local_58;
  int local_2c;
  size_t local_28;
  Type local_1c;
  ByteString *local_18;
  bool local_1;
  
  local_1c = in_RDI->currentCipherMode;
  local_28 = in_RDI->currentTagBytes;
  local_18 = in_RSI;
  bVar1 = SymmetricAlgorithm::encryptFinal(in_RDI,in_RSI);
  if (bVar1) {
    (*in_RDI->_vptr_SymmetricAlgorithm[0xd])();
    ByteString::resize((ByteString *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    sVar3 = ByteString::size((ByteString *)0x1334e4);
    local_2c = (int)sVar3;
    ctx = (EVP_CIPHER_CTX *)in_RDI[1]._vptr_SymmetricAlgorithm;
    puVar4 = ByteString::operator[]
                       ((ByteString *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    iVar2 = EVP_EncryptFinal(ctx,puVar4,&local_2c);
    if (iVar2 == 0) {
      e = ERR_get_error();
      pcVar5 = ERR_error_string(e,(char *)0x0);
      softHSMLog(3,"encryptFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                 ,0x117,"EVP_EncryptFinal failed: %s",pcVar5);
      clean((OSSLEVPSymmetricAlgorithm *)in_stack_ffffffffffffff60);
      local_1 = false;
    }
    else {
      ByteString::resize((ByteString *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      if (local_1c == GCM) {
        append = &local_58;
        ByteString::ByteString((ByteString *)0x1335a1);
        ByteString::resize((ByteString *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        in_stack_ffffffffffffff60 = (EVP_CIPHER_CTX *)in_RDI[1]._vptr_SymmetricAlgorithm;
        iVar2 = (int)local_28;
        puVar4 = ByteString::operator[]
                           ((ByteString *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        EVP_CIPHER_CTX_ctrl(in_stack_ffffffffffffff60,0x10,iVar2,puVar4);
        ByteString::operator+=(local_18,append);
        ByteString::~ByteString((ByteString *)0x13361b);
      }
      clean((OSSLEVPSymmetricAlgorithm *)in_stack_ffffffffffffff60);
      local_1 = true;
    }
  }
  else {
    clean((OSSLEVPSymmetricAlgorithm *)in_stack_ffffffffffffff60);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool OSSLEVPSymmetricAlgorithm::encryptFinal(ByteString& encryptedData)
{
	SymMode::Type mode = currentCipherMode;
	size_t tagBytes = currentTagBytes;

	if (!SymmetricAlgorithm::encryptFinal(encryptedData))
	{
		clean();
		return false;
	}

	// Prepare the output block
	encryptedData.resize(getBlockSize());

	int outLen = encryptedData.size();

	if (!EVP_EncryptFinal(pCurCTX, &encryptedData[0], &outLen))
	{
		ERROR_MSG("EVP_EncryptFinal failed: %s", ERR_error_string(ERR_get_error(), NULL));

		clean();

		return false;
	}

	// Resize the output block
	encryptedData.resize(outLen);

	if (mode == SymMode::GCM)
	{
		ByteString tag;
		tag.resize(tagBytes);
		EVP_CIPHER_CTX_ctrl(pCurCTX, EVP_CTRL_GCM_GET_TAG, tagBytes, &tag[0]);
		encryptedData += tag;
	}

	clean();

	return true;
}